

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O0

int __thiscall miniros::TopicManager::shutdown(TopicManager *this,int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  element_type *peVar2;
  element_type *peVar3;
  int __how_00;
  int __fd_00;
  undefined1 uVar4;
  SubscriptionPtr s;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
  *__range2_1;
  scoped_lock<std::mutex> subs_lock;
  bool enabled_2;
  PublicationPtr pub;
  iterator __end2;
  iterator __begin2;
  V_Publication *__range2;
  scoped_lock<std::recursive_mutex> adv_lock;
  bool enabled_1;
  bool enabled;
  scoped_lock<std::mutex> shutdown_lock;
  char *in_stack_fffffffffffffe98;
  Connection *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffeb0;
  Publication *in_stack_fffffffffffffec0;
  Level level;
  string *in_stack_fffffffffffffec8;
  LogLocation *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  _Self local_f0;
  _Self local_e8;
  void *in_stack_ffffffffffffff20;
  RPCManager *in_stack_ffffffffffffff28;
  allocator<char> local_c9;
  string local_c8 [32];
  LogLocation local_a8;
  shared_ptr<miniros::Publication> *local_98;
  __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
  local_90;
  V_Publication *local_88;
  string *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 uVar5;
  _Alloc_hider in_stack_ffffffffffffff8f;
  string local_70 [38];
  undefined1 local_4a;
  allocator<char> local_49;
  string local_48 [52];
  undefined4 local_14;
  TopicManager *local_8;
  
  local_8 = this;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffea0,
             (mutex_type *)in_stack_fffffffffffffe98);
  if ((this->shutting_down_ & 1U) == 0) {
    std::lock<std::mutex,std::recursive_mutex>
              ((mutex *)in_stack_fffffffffffffed0,(recursive_mutex *)in_stack_fffffffffffffec8);
    this->shutting_down_ = true;
    std::mutex::unlock((mutex *)0x4f19b3);
    std::recursive_mutex::unlock((recursive_mutex *)0x4f19c3);
    std::
    unique_ptr<miniros::TopicManager::PollWatcher,_std::default_delete<miniros::TopicManager::PollWatcher>_>
    ::operator->((unique_ptr<miniros::TopicManager::PollWatcher,_std::default_delete<miniros::TopicManager::PollWatcher>_>
                  *)0x4f19d6);
    observer::Connection::disconnect(in_stack_fffffffffffffea0);
    std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4f19f1);
    RPCManager::unbind(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4f1a13);
    RPCManager::unbind(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4f1a35);
    RPCManager::unbind(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4f1a57);
    RPCManager::unbind(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4f1a79);
    RPCManager::unbind(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4f1a9b);
    RPCManager::unbind(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((shutdown::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,
                 (char *)CONCAT17(in_stack_fffffffffffffedf,
                                  CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                 (allocator<char> *)in_stack_fffffffffffffed0);
      console::initializeLogLocation
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (Level)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    if (shutdown::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffea0,
                 (Level)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffeb0);
    }
    local_4a = (shutdown::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_4a) {
      in_stack_fffffffffffffe98 = "Shutting down topics...";
      console::print((FilterBase *)0x0,shutdown::loc.logger_,(Level)(ulong)shutdown::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0x96,"void miniros::TopicManager::shutdown()");
    }
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((shutdown()::loc.initialized_ ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffee0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffff8f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,
                 (char *)CONCAT17(in_stack_fffffffffffffedf,
                                  CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                 (allocator<char> *)in_stack_fffffffffffffed0);
      console::initializeLogLocation
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (Level)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    }
    if (shutdown()::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffea0,
                 (Level)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffeb0);
    }
    uVar4 = (shutdown()::loc.logger_enabled_ & 1U) != 0;
    uVar5 = uVar4;
    if ((bool)uVar4) {
      in_stack_fffffffffffffe98 = "  shutting down publishers";
      console::print((FilterBase *)0x0,shutdown()::loc.logger_,(Level)(ulong)shutdown()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0x97,"void miniros::TopicManager::shutdown()");
    }
    std::scoped_lock<std::recursive_mutex>::scoped_lock
              ((scoped_lock<std::recursive_mutex> *)in_stack_fffffffffffffea0,
               (mutex_type *)in_stack_fffffffffffffe98);
    local_88 = &this->advertised_topics_;
    local_90._M_current =
         (shared_ptr<miniros::Publication> *)
         std::
         vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
         ::begin((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                  *)in_stack_fffffffffffffe98);
    local_98 = (shared_ptr<miniros::Publication> *)
               std::
               vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
               ::end((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                      *)in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                               *)in_stack_fffffffffffffe98), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
      ::operator*(&local_90);
      in_stack_fffffffffffffed0 = &local_a8;
      std::shared_ptr<miniros::Publication>::shared_ptr
                ((shared_ptr<miniros::Publication> *)in_stack_fffffffffffffea0,
                 (shared_ptr<miniros::Publication> *)in_stack_fffffffffffffe98);
      peVar2 = std::
               __shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4f1e48);
      in_stack_fffffffffffffede = Publication::isDropped(peVar2);
      if (!(bool)in_stack_fffffffffffffede) {
        peVar2 = std::
                 __shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4f1e6d);
        in_stack_fffffffffffffec8 = Publication::getName_abi_cxx11_(peVar2);
        unregisterPublisher((TopicManager *)
                            CONCAT17(in_stack_ffffffffffffff8f,
                                     CONCAT16(uVar5,in_stack_ffffffffffffff88)),
                            in_stack_ffffffffffffff80);
      }
      std::__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4f1ecf);
      Publication::drop(in_stack_fffffffffffffec0);
      std::shared_ptr<miniros::Publication>::~shared_ptr
                ((shared_ptr<miniros::Publication> *)0x4f1ee6);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
      ::operator++(&local_90);
    }
    std::
    vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
    ::clear((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             *)0x4f1f06);
    std::scoped_lock<std::recursive_mutex>::~scoped_lock
              ((scoped_lock<std::recursive_mutex> *)0x4f1f13);
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((shutdown()::loc.initialized_ ^ 0xffU) & 1) != 0) {
      level = (Level)((ulong)&local_c9 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,
                 (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8
                                                )),(allocator<char> *)in_stack_fffffffffffffed0);
      console::initializeLogLocation(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,level);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    if (shutdown()::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffea0,
                 (Level)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffeb0);
    }
    if ((shutdown()::loc.logger_enabled_ & 1U) != 0) {
      in_stack_fffffffffffffe98 = "  shutting down subscribers";
      console::print((FilterBase *)0x0,shutdown()::loc.logger_,(Level)(ulong)shutdown()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/topic_manager.cpp"
                     ,0xa4,"void miniros::TopicManager::shutdown()");
    }
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffea0,
               (mutex_type *)in_stack_fffffffffffffe98);
    local_e8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
         ::begin((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                  *)in_stack_fffffffffffffe98);
    local_f0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
         ::end((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                *)in_stack_fffffffffffffe98);
    while (bVar1 = std::operator!=(&local_e8,&local_f0), bVar1) {
      std::_List_iterator<std::shared_ptr<miniros::Subscription>_>::operator*
                ((_List_iterator<std::shared_ptr<miniros::Subscription>_> *)0x4f20f8);
      std::shared_ptr<miniros::Subscription>::shared_ptr
                ((shared_ptr<miniros::Subscription> *)in_stack_fffffffffffffea0,
                 (shared_ptr<miniros::Subscription> *)in_stack_fffffffffffffe98);
      peVar3 = std::
               __shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4f2114);
      in_stack_fffffffffffffeb0 = Subscription::getName_abi_cxx11_(peVar3);
      __fd_00 = (int)in_stack_fffffffffffffeb0;
      unregisterSubscriber
                ((TopicManager *)
                 CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(uVar5,in_stack_ffffffffffffff88)),
                 in_stack_ffffffffffffff80);
      peVar3 = std::
               __shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4f213e);
      Subscription::shutdown(peVar3,__fd_00,__how_00);
      std::shared_ptr<miniros::Subscription>::~shared_ptr
                ((shared_ptr<miniros::Subscription> *)0x4f2152);
      std::_List_iterator<std::shared_ptr<miniros::Subscription>_>::operator++(&local_e8);
    }
    std::__cxx11::
    list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
    ::clear((list<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
             *)in_stack_fffffffffffffea0);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4f21ac);
    std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffeb0);
    std::__shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffeb0);
    std::__shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffeb0);
    std::__shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffeb0);
    local_14 = 0;
  }
  else {
    local_14 = 1;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4f2208);
  return extraout_EAX;
}

Assistant:

void TopicManager::shutdown()
{
  std::scoped_lock<std::mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_) {
    return;
  }

  {
    std::lock(subs_mutex_, advertised_topics_mutex_);
    shutting_down_ = true;
    subs_mutex_.unlock();
    advertised_topics_mutex_.unlock();
  }

  poll_watcher_->disconnect();

  rpc_manager_->unbind("publisherUpdate");
  rpc_manager_->unbind("requestTopic");
  rpc_manager_->unbind("getBusStats");
  rpc_manager_->unbind("getBusInfo");
  rpc_manager_->unbind("getSubscriptions");
  rpc_manager_->unbind("getPublications");

  MINIROS_DEBUG("Shutting down topics...");
  MINIROS_DEBUG("  shutting down publishers");
  {
    std::scoped_lock<std::recursive_mutex> adv_lock(advertised_topics_mutex_);

    for (PublicationPtr pub : advertised_topics_) {
      if (!pub->isDropped())
        unregisterPublisher(pub->getName());
      pub->drop();
    }
    advertised_topics_.clear();
  }

  // unregister all of our subscriptions
  MINIROS_DEBUG("  shutting down subscribers");
  {
    std::scoped_lock<std::mutex> subs_lock(subs_mutex_);

    for (SubscriptionPtr s : subscriptions_) {
      // Remove us as a subscriber from the master
      unregisterSubscriber(s->getName());
      // now, drop our side of the connection
      s->shutdown();
    }
    subscriptions_.clear();
  }

  rpc_manager_.reset();
  connection_manager_.reset();
  poll_manager_.reset();
  master_link_.reset();
}